

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_pow(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  type_info *ptVar2;
  numeric *pnVar3;
  runtime_error *this_00;
  any *in_RCX;
  allocator local_59;
  long local_58;
  numeric_integer local_50;
  longdouble local_44;
  string local_38;
  
  ptVar2 = cs_impl::any::type(b);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&numeric::typeinfo);
  if (bVar1) {
    ptVar2 = cs_impl::any::type(in_RCX);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&numeric::typeinfo);
    if (bVar1) {
      pnVar3 = cs_impl::any::const_val<cs::numeric>(b);
      local_58 = (pnVar3->data)._int;
      local_44 = *(longdouble *)&pnVar3->data;
      if (pnVar3->type != false) {
        local_44 = (longdouble)local_58;
      }
      pnVar3 = cs_impl::any::const_val<cs::numeric>(in_RCX);
      local_50 = (pnVar3->data)._int;
      powl();
      local_38.field_2._M_local_buf[0] = '\0';
      cs_impl::any::any<cs::numeric>((any *)this,(numeric *)&local_38);
      return (var)(proxy *)this;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Unsupported operator operations(Pow).",&local_59);
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_pow(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return numeric(std::pow(a.const_val<numeric>().as_float(), b.const_val<numeric>().as_float()));
		else
			throw runtime_error("Unsupported operator operations(Pow).");
	}